

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O0

Object * __thiscall
flatbuffers::BaseBfbsGenerator::GetObject(BaseBfbsGenerator *this,Type *type,bool element_type)

{
  bool bVar1;
  char *pcVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  int __c_00;
  Type *pTVar3;
  BaseType local_34;
  BaseType base_type;
  bool element_type_local;
  Type *type_local;
  BaseBfbsGenerator *this_local;
  
  pTVar3 = type;
  if (element_type) {
    local_34 = reflection::Type::element(type);
    __c = extraout_EDX;
  }
  else {
    local_34 = reflection::Type::base_type(type);
    __c = extraout_EDX_00;
  }
  pcVar2 = reflection::Type::index(type,(char *)pTVar3,__c);
  if (((int)pcVar2 < 0) || (bVar1 = anon_unknown_25::IsStructOrTable(local_34), !bVar1)) {
    this_local = (BaseBfbsGenerator *)0x0;
  }
  else {
    pcVar2 = reflection::Type::index(type,(char *)pTVar3,__c_00);
    this_local = (BaseBfbsGenerator *)GetObjectByIndex(this,(int32_t)pcVar2);
  }
  return (Object *)this_local;
}

Assistant:

const reflection::Object *GetObject(const reflection::Type *type,
                                      bool element_type = false) const {
    const reflection::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (type->index() >= 0 && IsStructOrTable(base_type)) {
      return GetObjectByIndex(type->index());
    }
    return nullptr;
  }